

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

String * asl::Url::encode(String *__return_storage_ptr__,String *q0_,bool component)

{
  byte bVar1;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  byte *pbVar4;
  char *pcVar5;
  long lVar6;
  byte b;
  
  iVar2 = 0;
  if (0 < q0_->_len) {
    iVar2 = q0_->_len;
  }
  String::alloc(__return_storage_ptr__,iVar2);
  __return_storage_ptr__->_len = 0;
  paVar3 = &__return_storage_ptr__->field_2;
  if (__return_storage_ptr__->_size != 0) {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  paVar3->_space[0] = '\0';
  if (0 < q0_->_len) {
    pcVar5 = "-_.!~*\'();/?:@&=+$,#";
    if (component) {
      pcVar5 = "-_.!~*\'()";
    }
    lVar6 = 0;
    do {
      paVar3 = &q0_->field_2;
      if (q0_->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(q0_->field_2)._str;
      }
      b = paVar3->_space[lVar6];
      iVar2 = isalnum((uint)b);
      pbVar4 = (byte *)pcVar5;
      if (iVar2 == 0) {
        do {
          bVar1 = *pbVar4;
          if (bVar1 == b) break;
          pbVar4 = pbVar4 + 1;
        } while (bVar1 != 0);
        if (bVar1 == 0) {
          String::operator+=(__return_storage_ptr__,'%');
          String::operator+=(__return_storage_ptr__,"0123456789ABCDEF"[b >> 4]);
          b = "0123456789ABCDEF"[b & 0xf];
        }
      }
      String::operator+=(__return_storage_ptr__,b);
      lVar6 = lVar6 + 1;
    } while (lVar6 < q0_->_len);
  }
  return __return_storage_ptr__;
}

Assistant:

String Url::encode(const String& q0_, bool component)
{
#ifdef ASL_ANSI
	String q0 = localToUtf8(q0_);
#else
	const String& q0 = q0_;
#endif

	String q(q0.length(), 0);
	for (int i = 0; i < q0.length(); i++)
	{
		byte c = *(byte*)&q0[i];
		if (!isalnum(c) && !isanyof(c, component ? "-_.!~*'()" : "-_.!~*'();/?:@&=+$,#"))
			q << '%' << hexNibble(c >> 4) << hexNibble(c & 0x0f);
		else
			q << (char)c;
	}
	return q;
}